

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

container_t * container_remove(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  ushort uVar1;
  uint16_t uVar2;
  int iVar3;
  undefined8 in_RAX;
  uint16_t *puVar4;
  uint uVar5;
  undefined7 in_register_00000011;
  uint uVar7;
  int iVar8;
  int iVar9;
  undefined8 uStack_38;
  ulong uVar6;
  
  uStack_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  uStack_38._0_4_ = CONCAT13(typecode,(int3)in_RAX);
  uVar7 = (uint)CONCAT71(in_register_00000011,typecode);
  if (uVar7 == 4) {
    c = shared_container_extract_copy((shared_container_t *)c,(uint8_t *)((long)&uStack_38 + 3));
    uVar7 = (uint)uStack_38._3_1_;
  }
  if ((char)uVar7 == '\x03') {
    iVar3 = ((array_container_t *)c)->cardinality;
    if (0 < iVar3) {
      puVar4 = ((array_container_t *)c)->array;
      iVar9 = iVar3 + -1;
      uVar7 = 0;
      do {
        uVar5 = iVar9 + uVar7 >> 1;
        uVar6 = (ulong)uVar5;
        uVar1 = puVar4[uVar6 * 2];
        if (uVar1 < val) {
          uVar7 = uVar5 + 1;
        }
        else {
          if (uVar1 <= val) {
            uVar2 = puVar4[uVar6 * 2 + 1];
            if (uVar2 == 0) {
              memmove(puVar4 + (ulong)(ushort)uVar5 * 2,puVar4 + (ulong)(ushort)uVar5 * 2 + 2,
                      (long)(int)(iVar3 + ~(uVar5 & 0xffff)) << 2);
              ((array_container_t *)c)->cardinality = ((array_container_t *)c)->cardinality + -1;
            }
            else {
              puVar4[uVar6 * 2] = uVar1 + 1;
              puVar4[uVar6 * 2 + 1] = uVar2 - 1;
            }
            goto LAB_00109462;
          }
          iVar9 = uVar5 - 1;
        }
      } while ((int)uVar7 <= iVar9);
      if (uVar7 != 0) {
        uVar6 = (ulong)uVar7;
        uVar5 = (uint)val - (uint)puVar4[uVar6 * 2 + -2];
        uVar1 = puVar4[uVar6 * 2 + -1];
        if ((int)uVar5 < (int)(uint)uVar1) {
          uStack_38 = (ulong)CONCAT24(uVar1,(undefined4)uStack_38);
          puVar4[uVar6 * 2 + -1] = (ushort)uVar5 - 1;
          if (((array_container_t *)c)->capacity <= iVar3) {
            run_container_grow((run_container_t *)c,iVar3 + 1,true);
            iVar3 = ((array_container_t *)c)->cardinality;
            puVar4 = ((array_container_t *)c)->array;
          }
          uVar7 = uVar7 & 0xffff;
          memmove(puVar4 + (ulong)uVar7 * 2 + 2,puVar4 + (ulong)uVar7 * 2,
                  (long)(int)(iVar3 - uVar7) << 2);
          ((array_container_t *)c)->cardinality = ((array_container_t *)c)->cardinality + 1;
          puVar4 = ((array_container_t *)c)->array;
          puVar4[uVar6 * 2] = val + 1;
          puVar4[uVar6 * 2 + 1] = (short)(uStack_38 >> 0x20) + ~(ushort)uVar5;
        }
        else if (uVar5 == uVar1) {
          puVar4[uVar6 * 2 + -1] = uVar1 - 1;
        }
      }
    }
LAB_00109462:
    *new_typecode = '\x03';
  }
  else if ((uVar7 & 0xff) == 2) {
    *new_typecode = '\x02';
    iVar3 = ((array_container_t *)c)->cardinality;
    if (0 < iVar3) {
      puVar4 = ((array_container_t *)c)->array;
      iVar9 = iVar3 + -1;
      iVar8 = 0;
      do {
        uVar7 = (uint)(iVar9 + iVar8) >> 1;
        uVar1 = *(ushort *)((long)puVar4 + (ulong)(iVar9 + iVar8 & 0xfffffffe));
        if (uVar1 < val) {
          iVar8 = uVar7 + 1;
        }
        else {
          if (uVar1 <= val) {
            memmove(puVar4 + uVar7,puVar4 + (ulong)uVar7 + 1,(long)(int)(iVar3 + ~uVar7) * 2);
            ((array_container_t *)c)->cardinality = ((array_container_t *)c)->cardinality + -1;
            return (array_container_t *)c;
          }
          iVar9 = uVar7 - 1;
        }
      } while (iVar8 <= iVar9);
    }
  }
  else {
    uVar6 = *(ulong *)(((array_container_t *)c)->array + (ulong)(val >> 6) * 4);
    iVar3 = ((array_container_t *)c)->cardinality - (uint)((uVar6 >> ((ulong)val & 0x3f) & 1) != 0);
    ((array_container_t *)c)->cardinality = iVar3;
    *(ulong *)(((array_container_t *)c)->array + (ulong)(val >> 6) * 4) =
         uVar6 & ~(1L << ((ulong)val & 0x3f));
    if (((uVar6 >> ((ulong)val & 0x3f) & 1) == 0) || (0x1000 < iVar3)) {
      *new_typecode = '\x01';
    }
    else {
      *new_typecode = '\x02';
      c = array_container_from_bitset((bitset_container_t *)c);
    }
  }
  return (array_container_t *)c;
}

Assistant:

static inline container_t *container_remove(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode) {
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            if (bitset_container_remove(CAST_bitset(c), val)) {
                int card = bitset_container_cardinality(CAST_bitset(c));
                if (card <= DEFAULT_MAX_SIZE) {
                    *new_typecode = ARRAY_CONTAINER_TYPE;
                    return array_container_from_bitset(CAST_bitset(c));
                }
            }
            *new_typecode = typecode;
            return c;
        case ARRAY_CONTAINER_TYPE:
            *new_typecode = typecode;
            array_container_remove(CAST_array(c), val);
            return c;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_remove(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            roaring_unreachable;
            return NULL;
    }
}